

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(TreeEnsembleParameters *a,TreeEnsembleParameters *b)

{
  bool bVar1;
  
  bVar1 = operator==(&a->nodes_,&b->nodes_);
  if ((bVar1) && (a->numpredictiondimensions_ == b->numpredictiondimensions_)) {
    bVar1 = operator==(&a->basepredictionvalue_,&b->basepredictionvalue_);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(const TreeEnsembleParameters& a,
                        const TreeEnsembleParameters& b) {
            if (a.nodes() != b.nodes()) {
                return false;
            }
            if (a.numpredictiondimensions() != b.numpredictiondimensions()) {
                return false;
            }
            if (a.basepredictionvalue() != b.basepredictionvalue()) {
                return false;
            }
            return true;
        }